

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2predicates.cc
# Opt level: O3

int s2pred::StableSign(S2Point *a,S2Point *b,S2Point *c)

{
  double dVar1;
  double dVar2;
  undefined1 auVar3 [16];
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  undefined4 in_EAX;
  int iVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  
  dVar14 = b->c_[0];
  dVar1 = a->c_[0];
  dVar2 = c->c_[2];
  dVar4 = a->c_[1];
  dVar5 = a->c_[2];
  dVar6 = c->c_[0];
  dVar7 = c->c_[1];
  dVar8 = b->c_[1];
  dVar9 = b->c_[2];
  dVar21 = dVar8 - dVar4;
  dVar15 = dVar2 - dVar9;
  dVar16 = dVar6 - dVar14;
  dVar17 = dVar9 - dVar5;
  dVar18 = dVar14 - dVar1;
  dVar22 = dVar1 - dVar6;
  dVar23 = dVar4 - dVar7;
  dVar12 = dVar5 - dVar2;
  dVar13 = dVar7 - dVar8;
  dVar11 = dVar18 * dVar18 + dVar21 * dVar21 + dVar17 * dVar17;
  dVar19 = dVar15 * dVar15 + dVar13 * dVar13 + dVar16 * dVar16;
  dVar20 = dVar12 * dVar12 + dVar23 * dVar23 + dVar22 * dVar22;
  auVar3._8_8_ = -(ulong)(dVar11 < dVar20);
  auVar3._0_8_ = -(ulong)(dVar11 < dVar19);
  iVar10 = movmskpd(in_EAX,auVar3);
  if (iVar10 == 0) {
    dVar14 = -(dVar2 * (dVar22 * dVar13 - dVar16 * dVar23) +
              (dVar23 * dVar15 - dVar13 * dVar12) * dVar6 + 0.0 +
              dVar7 * (dVar16 * dVar12 - dVar15 * dVar22));
    dVar11 = dVar20 * dVar19;
  }
  else if (dVar20 <= dVar19) {
    dVar14 = -(dVar5 * (dVar18 * dVar23 - dVar22 * dVar21) +
              dVar1 * (dVar21 * dVar12 - dVar23 * dVar17) + 0.0 +
              dVar4 * (dVar17 * dVar22 - dVar12 * dVar18));
    dVar11 = dVar20 * dVar11;
  }
  else {
    dVar14 = -(dVar9 * (dVar21 * dVar16 - dVar13 * dVar18) +
              dVar14 * (dVar13 * dVar17 - dVar21 * dVar15) + 0.0 +
              dVar8 * (dVar18 * dVar15 - dVar16 * dVar17));
    dVar11 = dVar11 * dVar19;
  }
  if (dVar11 < 0.0) {
    dVar11 = sqrt(dVar11);
  }
  else {
    dVar11 = SQRT(dVar11);
  }
  iVar10 = ((0.0 < dVar14) - 1) + (uint)(0.0 < dVar14);
  if (ABS(dVar14) <= dVar11 * 7.176703675781937e-16) {
    iVar10 = 0;
  }
  return iVar10;
}

Assistant:

int StableSign(const S2Point& a, const S2Point& b, const S2Point& c) {
  Vector3_d ab = b - a;
  Vector3_d bc = c - b;
  Vector3_d ca = a - c;
  double ab2 = ab.Norm2();
  double bc2 = bc.Norm2();
  double ca2 = ca.Norm2();

  // Now compute the determinant ((A-C)x(B-C)).C, where the vertices have been
  // cyclically permuted if necessary so that AB is the longest edge.  (This
  // minimizes the magnitude of cross product.)  At the same time we also
  // compute the maximum error in the determinant.  Using a similar technique
  // to the one used for kMaxDetError, the error is at most
  //
  //   |d| <= (3 + 6/sqrt(3)) * |A-C| * |B-C| * e
  //
  // where e = 0.5 * DBL_EPSILON.  If the determinant magnitude is larger than
  // this value then we know its sign with certainty.
  const double kDetErrorMultiplier = 3.2321 * DBL_EPSILON;  // see above
  double det, max_error;
  if (ab2 >= bc2 && ab2 >= ca2) {
    // AB is the longest edge, so compute (A-C)x(B-C).C.
    det = -(ca.CrossProd(bc).DotProd(c));
    max_error = kDetErrorMultiplier * sqrt(ca2 * bc2);
  } else if (bc2 >= ca2) {
    // BC is the longest edge, so compute (B-A)x(C-A).A.
    det = -(ab.CrossProd(ca).DotProd(a));
    max_error = kDetErrorMultiplier * sqrt(ab2 * ca2);
  } else {
    // CA is the longest edge, so compute (C-B)x(A-B).B.
    det = -(bc.CrossProd(ab).DotProd(b));
    max_error = kDetErrorMultiplier * sqrt(bc2 * ab2);
  }
  return (fabs(det) <= max_error) ? 0 : (det > 0) ? 1 : -1;
}